

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O0

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::WriteTimedTextResource
          (h__Writer *this,string *XMLDoc,AESEncContext *Ctx,HMACContext *HMAC)

{
  ui32_t uVar1;
  int iVar2;
  ui32_t uVar3;
  byte_t *pbVar4;
  void *__src;
  uint *puVar5;
  Result_t local_598 [108];
  ui32_t local_52c;
  FileWriter local_528 [4];
  ui32_t write_count;
  undefined1 local_4c0 [8];
  UL TmpUL;
  Partition partition;
  UL local_3c0;
  Batch<ASDCP::UL> local_3a0 [64];
  ui64_t local_360;
  fpos_t here;
  Result_t local_2f0 [104];
  IndexTableSegment local_288 [8];
  IndexTableSegment segment;
  UUID local_230 [2];
  Rational local_1d8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
  local_1a0 [32];
  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
  local_180 [24];
  DeltaEntry local_168 [8];
  DeltaEntry nil_delta_entry;
  FileWriter local_158 [104];
  undefined1 local_f0 [8];
  FrameBuffer FrameBuf;
  ui32_t str_size;
  IndexEntry local_80 [8];
  IndexEntry index_entry;
  FrameBuffer local_68 [8];
  FrameBuffer segment_buffer;
  HMACContext *HMAC_local;
  AESEncContext *Ctx_local;
  string *XMLDoc_local;
  h__Writer *this_local;
  Result_t *result;
  
  ASDCP::FrameBuffer::FrameBuffer(local_68);
  ASDCP::MXF::IndexTableSegment::IndexEntry::IndexEntry(local_80);
  ASDCP::MXF::h__WriterState::Goto_RUNNING((h__WriterState *)this);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    FrameBuf.m_MIMEType.field_2._12_4_ = std::__cxx11::string::size();
    ASDCP::TimedText::FrameBuffer::FrameBuffer
              ((FrameBuffer *)local_f0,FrameBuf.m_MIMEType.field_2._12_4_);
    pbVar4 = ASDCP::FrameBuffer::Data((FrameBuffer *)local_f0);
    __src = (void *)std::__cxx11::string::c_str();
    memcpy(pbVar4,__src,(ulong)(uint)FrameBuf.m_MIMEType.field_2._12_4_);
    ASDCP::FrameBuffer::Size((FrameBuffer *)local_f0,FrameBuf.m_MIMEType.field_2._12_4_);
    ASDCP::Write_EKLV_Packet
              (local_158,(Dictionary *)(XMLDoc->field_2)._M_local_buf,
               (OP1aHeader *)XMLDoc->_M_string_length,(WriterInfo *)&XMLDoc[2].field_2,
               (FrameBuffer *)(XMLDoc[0x1b].field_2._M_local_buf + 8),
               (uint *)&XMLDoc[0x1a]._M_string_length,
               (ulonglong *)(XMLDoc[0x19].field_2._M_local_buf + 8),(FrameBuffer *)(XMLDoc + 0x1a),
               local_f0,(uint *)(XMLDoc[0x32].field_2._M_local_buf + 8),
               (AESEncContext *)&ASDCP::MXF_BER_LENGTH,HMAC);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_158);
    Kumu::Result_t::~Result_t((Result_t *)local_158);
    ASDCP::TimedText::FrameBuffer::~FrameBuffer((FrameBuffer *)local_f0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    ASDCP::MXF::IndexTableSegment::DeltaEntry::DeltaEntry(local_168);
    ASDCP::MXF::IndexTableSegment::IndexTableSegment
              (local_288,(Dictionary *)XMLDoc->_M_string_length);
    Kumu::GenRandomValue(local_230);
    std::
    vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
    ::push_back(local_1a0,local_168);
    ASDCP::MXF::Rational::operator=
              (&local_1d8,(Rational *)((long)&XMLDoc[0x33]._M_string_length + 4));
    local_1c8 = 0;
    local_1c0 = 0xffffffffffffffff;
    std::
    vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
    ::push_back(local_180,local_80);
    ASDCP::FrameBuffer::Capacity((uint)local_2f0);
    Kumu::Result_t::operator=((Result_t *)this,local_2f0);
    Kumu::Result_t::~Result_t(local_2f0);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      ASDCP::MXF::IndexTableSegment::WriteToBuffer((FrameBuffer *)&here);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&here);
      Kumu::Result_t::~Result_t((Result_t *)&here);
    }
    ASDCP::MXF::IndexTableSegment::~IndexTableSegment(local_288);
    ASDCP::MXF::IndexTableSegment::DeltaEntry::~DeltaEntry(local_168);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    local_360 = Kumu::IFileReader::TellPosition((IFileReader *)(XMLDoc->field_2)._M_local_buf);
    if (XMLDoc->_M_string_length == 0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0x22f,
                    "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::WriteTimedTextResource(const std::string &, ASDCP::AESEncContext *, ASDCP::HMACContext *)"
                   );
    }
    ASDCP::MXF::Partition::Partition
              ((Partition *)&stack0xfffffffffffffb78,(Dictionary *)XMLDoc->_M_string_length);
    ASDCP::FrameBuffer::Size(local_68);
    std::__cxx11::
    list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::back
              ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)&XMLDoc[0x17]._M_string_length);
    ASDCP::UL::operator=(&local_3c0,(UL *)((long)&XMLDoc[8].field_2 + 8));
    ASDCP::MXF::RIP::PartitionPair::PartitionPair
              ((PartitionPair *)(TmpUL.super_Identifier<16U>.m_Value + 0xf),0,local_360);
    std::__cxx11::
    list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::push_back
              ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)&XMLDoc[0x17]._M_string_length,
               (value_type *)(TmpUL.super_Identifier<16U>.m_Value + 0xf));
    ASDCP::MXF::RIP::PartitionPair::~PartitionPair
              ((PartitionPair *)(TmpUL.super_Identifier<16U>.m_Value + 0xf));
    ASDCP::MXF::Batch<ASDCP::UL>::operator=
              (local_3a0,(Batch<ASDCP::UL> *)(XMLDoc[9].field_2._M_local_buf + 8));
    pbVar4 = ASDCP::Dictionary::ul
                       ((Dictionary *)XMLDoc->_M_string_length,MDD_ClosedCompleteBodyPartition);
    ASDCP::UL::UL((UL *)local_4c0,pbVar4);
    ASDCP::MXF::Partition::WriteToFile(local_528,(UL *)&stack0xfffffffffffffb78);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_528);
    Kumu::Result_t::~Result_t((Result_t *)local_528);
    ASDCP::UL::~UL((UL *)local_4c0);
    ASDCP::MXF::Partition::~Partition((Partition *)&stack0xfffffffffffffb78);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    local_52c = 0;
    puVar5 = (uint *)ASDCP::FrameBuffer::RoData(local_68);
    ASDCP::FrameBuffer::Size(local_68);
    Kumu::FileWriter::Write((uchar *)local_598,(int)XMLDoc + 0x10,puVar5);
    Kumu::Result_t::operator=((Result_t *)this,local_598);
    Kumu::Result_t::~Result_t(local_598);
    uVar1 = local_52c;
    uVar3 = ASDCP::FrameBuffer::Size(local_68);
    if (uVar1 != uVar3) {
      __assert_fail("write_count == segment_buffer.Size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0x246,
                    "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::WriteTimedTextResource(const std::string &, ASDCP::AESEncContext *, ASDCP::HMACContext *)"
                   );
    }
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    *(int *)((long)&XMLDoc[0x19].field_2 + 8) = *(int *)((long)&XMLDoc[0x19].field_2 + 8) + 1;
  }
  ASDCP::MXF::IndexTableSegment::IndexEntry::~IndexEntry(local_80);
  ASDCP::FrameBuffer::~FrameBuffer(local_68);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::WriteTimedTextResource(const std::string& XMLDoc,
							       ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  ASDCP::FrameBuffer segment_buffer;
  IndexTableSegment::IndexEntry index_entry;
  Result_t result = m_State.Goto_RUNNING();

  if ( KM_SUCCESS(result) )
    {
      // TODO: make sure it's XML

      ui32_t str_size = XMLDoc.size();
      ASDCP::TimedText::FrameBuffer FrameBuf(str_size);
      
      memcpy(FrameBuf.Data(), XMLDoc.c_str(), str_size);
      FrameBuf.Size(str_size);
      index_entry.StreamOffset = m_StreamOffset;
      
      result = Write_EKLV_Packet(m_File, *m_Dict, m_HeaderPart, m_Info, m_CtFrameBuf, m_FramesWritten,
				 m_StreamOffset, FrameBuf, m_EssenceUL, MXF_BER_LENGTH, Ctx, HMAC);
    }

  if ( KM_SUCCESS(result) )
    {
      // encode the index table
      IndexTableSegment::DeltaEntry nil_delta_entry;
      IndexTableSegment segment(m_Dict);
      segment.m_Lookup = &m_HeaderPart.m_Primer;
      GenRandomValue(segment.InstanceUID);

      segment.DeltaEntryArray.push_back(nil_delta_entry);
      segment.IndexEditRate = m_EditRate;
      segment.IndexStartPosition = 0;
      segment.IndexDuration = -1;
      segment.IndexEntryArray.push_back(index_entry);

      result = segment_buffer.Capacity(MaxIndexSegmentSize); // segment-count * max-segment-size

      if ( KM_SUCCESS(result) )
	{
	  result = segment.WriteToBuffer(segment_buffer);
	}
    }

  if ( KM_SUCCESS(result) )
    {
      // create an index partition header
      Kumu::fpos_t here = m_File.TellPosition();
      assert(m_Dict);

      ASDCP::MXF::Partition partition(m_Dict);
      partition.MajorVersion = m_HeaderPart.MajorVersion;
      partition.MinorVersion = m_HeaderPart.MinorVersion;
      partition.ThisPartition = here;
      partition.BodySID = 0;
      partition.IndexSID = 129;
      partition.IndexByteCount = segment_buffer.Size();
      partition.PreviousPartition = m_RIP.PairArray.back().ByteOffset;
      partition.OperationalPattern = m_HeaderPart.OperationalPattern;

      m_RIP.PairArray.push_back(RIP::PartitionPair(0, here));
      partition.EssenceContainers = m_HeaderPart.EssenceContainers;
      UL TmpUL(m_Dict->ul(MDD_ClosedCompleteBodyPartition));
      result = partition.WriteToFile(m_File, TmpUL);
    }
  
  if ( KM_SUCCESS(result) )
    {
      // write the encoded index table
      ui32_t write_count = 0;
      result = m_File.Write(segment_buffer.RoData(), segment_buffer.Size(), &write_count);
      assert(write_count == segment_buffer.Size());
    }

  if ( KM_SUCCESS(result) )
    {
      m_FramesWritten++;
    }

  return result;
}